

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testHuf.cpp
# Opt level: O1

void anon_unknown.dwarf_17ff58::compressVerify(unsigned_short *raw,int n,uint dekHash)

{
  uint uVar1;
  undefined8 in_RAX;
  char *pcVar2;
  ostream *poVar3;
  long lVar4;
  uint uVar5;
  ulong uVar6;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX;
  pcVar2 = (char *)operator_new__((ulong)(n * 3 + 0x40000));
  uVar1 = Imf_3_4::hufCompress(raw,n,pcVar2);
  uVar5 = uVar1;
  if (0 < (int)uVar1) {
    lVar4 = 0;
    do {
      uVar5 = (uint)(byte)pcVar2[lVar4] ^ (uVar5 << 5 | uVar5 >> 0x1b);
      lVar4 = lVar4 + 1;
    } while (uVar1 != (uint)lVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"verifying compressed checksum hash = ",0x25);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  if (uVar5 != dekHash) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"hash verification failed. Got ",0x1e);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," expected ",10);
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    uStack_38 = CONCAT44(dekHash,(undefined4)uStack_38);
    if (0 < (int)uVar1) {
      uVar6 = 0;
      do {
        *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) =
             *(uint *)(&__cxxabiv1::__si_class_type_info::vtable + *(long *)(std::cout + -0x18)) &
             0xffffffb5 | 8;
        std::ostream::operator<<(&std::cout,(uint)(byte)pcVar2[uVar6]);
        if ((uVar6 & 0xf) == 0) {
          uStack_38._0_3_ = CONCAT12(10,(undefined2)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)((long)&uStack_38 + 2),1);
        }
        else {
          uStack_38._0_4_ = CONCAT13(0x20,(undefined3)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,(char *)((long)&uStack_38 + 3),1);
        }
        uVar6 = uVar6 + 1;
      } while (uVar1 != (uint)uVar6);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
    if (uVar5 != uStack_38._4_4_) {
      __assert_fail("compressedHash == dekHash",
                    "/workspace/llm4binary/github/license_c_cmakelists/AcademySoftwareFoundation[P]openexr/src/test/OpenEXRTest/testHuf.cpp"
                    ,0xca,
                    "void (anonymous namespace)::compressVerify(const unsigned short *, int, const unsigned int)"
                   );
    }
  }
  operator_delete__(pcVar2);
  return;
}

Assistant:

void
compressVerify (const unsigned short raw[], int n, const unsigned int dekHash)
{
    Array<char> compressed (3 * n + 4 * 65536);

    int nCompressed = hufCompress (raw, n, compressed);

    //
    // This hash algorithm proposed by Donald E. Knuth in
    // The Art Of Computer Programming Volume 3,
    // under the topic of sorting and search chapter 6.4.
    //
    unsigned int         compressedHash = nCompressed;
    const unsigned char* cptr =
        reinterpret_cast<const unsigned char*> ((const char*) compressed);
    for (int i = 0; i < nCompressed; ++i)
    {
        compressedHash =
            ((compressedHash << 5) ^ (compressedHash >> 27)) ^ (*cptr++);
    }

    cout << "verifying compressed checksum hash = " << compressedHash
         << std::endl;

    if (compressedHash != dekHash)
    {
        cout << "hash verification failed. Got " << compressedHash
             << " expected " << dekHash << std::endl;
        const unsigned char* cptr =
            reinterpret_cast<const unsigned char*> ((const char*) compressed);
        for (int i = 0; i < nCompressed; ++i)
        {
            cout << std::hex << (0xFF & (int) (*cptr++));
            if ((i & 0xF) == 0) { cout << '\n'; }
            else { cout << ' '; }
        }
        cout << "\n";
    }

    assert (compressedHash == dekHash);
}